

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void __thiscall Rml::DataParser::VariableGetSet(DataParser *this,String *name,bool is_assignment)

{
  pointer pvVar1;
  pointer pvVar2;
  DataAddress address;
  undefined1 local_68 [48];
  DataAddress local_38;
  
  DataExpressionInterface::ParseAddress(&local_38,&this->expression_interface,name);
  if (local_38.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_38.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    CreateString_abi_cxx11_
              ((String *)local_68,"Could not find data variable with name \'%s\'.",
               (name->_M_dataplus)._M_p);
    Error(this,(String *)local_68);
    if ((undefined1 *)CONCAT44(local_68._4_4_,local_68._0_4_) != local_68 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_68._4_4_,local_68._0_4_),local_68._16_8_ + 1);
    }
  }
  else {
    pvVar1 = (this->variable_addresses).
             super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->variable_addresses).
             super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::
    vector<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,std::allocator<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>
    ::emplace_back<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>
              ((vector<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,std::allocator<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>
                *)&this->variable_addresses,&local_38);
    local_68._0_4_ = Variable;
    if (is_assignment) {
      local_68._0_4_ = Assign;
    }
    local_68._8_8_ = NONE;
    Variant::Set((Variant *)(local_68 + 8),
                 (int)((ulong)((long)pvVar2 - (long)pvVar1) >> 3) * -0x55555555);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,(InstructionData *)local_68);
    Variant::~Variant((Variant *)(local_68 + 8));
  }
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&local_38);
  return;
}

Assistant:

void VariableGetSet(const String& name, bool is_assignment)
	{
		DataAddress address = expression_interface.ParseAddress(name);
		if (address.empty())
		{
			Error(CreateString("Could not find data variable with name '%s'.", name.c_str()));
			return;
		}
		int index = int(variable_addresses.size());
		variable_addresses.push_back(std::move(address));
		program.push_back(InstructionData{is_assignment ? Instruction::Assign : Instruction::Variable, Variant(int(index))});
	}